

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateUseDeclaration(bool is_descriptor,Printer *printer)

{
  byte in_DIL;
  char *in_stack_00000038;
  Printer *in_stack_00000040;
  
  if ((in_DIL & 1) == 0) {
    io::Printer::Print<>(in_stack_00000040,in_stack_00000038);
  }
  else {
    io::Printer::Print<>(in_stack_00000040,in_stack_00000038);
  }
  return;
}

Assistant:

void GenerateUseDeclaration(bool is_descriptor, io::Printer* printer) {
  if (!is_descriptor) {
    printer->Print(
        "use Google\\Protobuf\\Internal\\GPBType;\n"
        "use Google\\Protobuf\\Internal\\RepeatedField;\n"
        "use Google\\Protobuf\\Internal\\GPBUtil;\n\n");
  } else {
    printer->Print(
        "use Google\\Protobuf\\Internal\\GPBType;\n"
        "use Google\\Protobuf\\Internal\\GPBWire;\n"
        "use Google\\Protobuf\\Internal\\RepeatedField;\n"
        "use Google\\Protobuf\\Internal\\InputStream;\n"
        "use Google\\Protobuf\\Internal\\GPBUtil;\n\n");
  }
}